

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O1

Ptr __thiscall core::image::desaturate<unsigned_char>(image *this,ConstPtr *img,DesaturateType type)

{
  int iVar1;
  element_type *peVar2;
  long *plVar3;
  code *pcVar4;
  undefined1 uVar5;
  int iVar6;
  Image<unsigned_char> *__p;
  invalid_argument *piVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  Ptr PVar13;
  
  peVar2 = (img->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Null image given");
  }
  else {
    iVar1 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
    if (0xfffffffd < iVar1 - 5U) {
      __p = (Image<unsigned_char> *)operator_new(0x30);
      (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.w = 0;
      (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.h = 0;
      (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 0;
      (__p->super_TypedImageBase<unsigned_char>).data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super_TypedImageBase<unsigned_char>).data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super_TypedImageBase<unsigned_char>).data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase =
           (_func_int **)&PTR__TypedImageBase_0014dd28;
      *(Image<unsigned_char> **)this = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
      plVar3 = *(long **)this;
      peVar2 = (img->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar10 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
      iVar6 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
      (**(code **)(*plVar3 + 0x40))(plVar3);
      uVar9 = (iVar1 == 4) + 1;
      *(int *)(plVar3 + 1) = iVar10;
      *(int *)((long)plVar3 + 0xc) = iVar6;
      *(uint *)(plVar3 + 2) = uVar9;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar3 + 3),
                 (long)(iVar6 * iVar10 << (iVar1 == 4)));
      if (type < (DESATURATE_AVERAGE|DESATURATE_LIGHTNESS)) {
        peVar2 = (img->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar10 = (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h *
                 (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
        _Var8._M_pi = extraout_RDX;
        if (0 < iVar10) {
          pcVar4 = (code *)(&PTR_desaturate_maximum<unsigned_char>_0014ecf0)[type];
          lVar12 = 0;
          uVar11 = 0 << (iVar1 == 4);
          do {
            uVar5 = (*pcVar4)((((img->
                                super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->super_TypedImageBase<unsigned_char>).data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar11);
            *(undefined1 *)(*(long *)(*(long *)this + 0x18) + lVar12) = uVar5;
            iVar6 = 3;
            if (iVar1 == 4) {
              *(uchar *)(*(long *)(*(long *)this + 0x18) + 1 + lVar12) =
                   (((img->
                     super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->super_TypedImageBase<unsigned_char>).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start[(ulong)uVar11 + 3];
              iVar6 = 4;
            }
            lVar12 = lVar12 + (ulong)uVar9;
            uVar11 = uVar11 + iVar6;
            iVar10 = iVar10 + -1;
            _Var8._M_pi = extraout_RDX_00;
          } while (iVar10 != 0);
        }
        PVar13.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var8._M_pi;
        PVar13.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (Ptr)PVar13.
                    super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
      }
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar7,"Invalid desaturate type");
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Image must be RGB or RGBA");
  }
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
desaturate (typename Image<T>::ConstPtr img, DesaturateType type)
{
    if (img == nullptr)
        throw std::invalid_argument("Null image given");

    int ic = img->channels();
    if (ic != 3 && ic != 4)
        throw std::invalid_argument("Image must be RGB or RGBA");

    bool has_alpha = (ic == 4);

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(img->width(), img->height(), 1 + has_alpha);

    typedef T(*DesaturateFunc)(T const*);
    DesaturateFunc func;
    switch (type)
    {
        case DESATURATE_MAXIMUM: func = desaturate_maximum<T>; break;
        case DESATURATE_LIGHTNESS: func = desaturate_lightness<T>; break;
        case DESATURATE_LUMINOSITY: func = desaturate_luminosity<T>; break;
        case DESATURATE_LUMINANCE: func = desaturate_luminance<T>; break;
        case DESATURATE_AVERAGE: func = desaturate_average<T>; break;
        default: throw std::invalid_argument("Invalid desaturate type");
    }

    int outpos = 0;
    int inpos = 0;
    int pixels = img->get_pixel_amount();
    for (int i = 0; i < pixels; ++i)
    {
        T const* v = &img->at(inpos);
        out->at(outpos) = func(v);

        if (has_alpha)
            out->at(outpos + 1) = img->at(inpos + 3);

        outpos += 1 + has_alpha;
        inpos += 3 + has_alpha;
    }

    return out;
}